

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  ulong uVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  int iVar4;
  ulong *puVar5;
  size_t sVar6;
  long lVar7;
  size_t nblimbs;
  ulong uVar8;
  bool bVar9;
  
  bVar9 = X == B;
  if (bVar9) {
    B = A;
  }
  if ((A == X || bVar9) || (iVar3 = mbedtls_mpi_copy(X,A), iVar3 == 0)) {
    X->s = 1;
    nblimbs = B->n;
    if (nblimbs != 0) {
      do {
        if (B->p[nblimbs - 1] != 0) goto LAB_0012197a;
        nblimbs = nblimbs - 1;
      } while (nblimbs != 0);
    }
    nblimbs = 0;
LAB_0012197a:
    iVar3 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar3 == 0) {
      if (nblimbs == 0) {
        iVar3 = 0;
      }
      else {
        puVar5 = X->p;
        pmVar2 = B->p;
        uVar8 = 0;
        sVar6 = 0;
        do {
          uVar1 = uVar8 + *puVar5;
          uVar8 = (ulong)CARRY8(uVar1,pmVar2[sVar6]) + (ulong)CARRY8(uVar8,*puVar5);
          *puVar5 = uVar1 + pmVar2[sVar6];
          sVar6 = sVar6 + 1;
          puVar5 = puVar5 + 1;
        } while (nblimbs != sVar6);
        iVar3 = 0;
        if (uVar8 != 0) {
          lVar7 = nblimbs * 8;
          do {
            if (X->n <= nblimbs) {
              iVar4 = mbedtls_mpi_grow(X,nblimbs + 1);
              if (iVar4 != 0) {
                return iVar4;
              }
              puVar5 = (ulong *)((long)X->p + lVar7);
            }
            lVar7 = lVar7 + 8;
            bVar9 = CARRY8(*puVar5,uVar8);
            *puVar5 = *puVar5 + uVar8;
            puVar5 = puVar5 + 1;
            uVar8 = 1;
            nblimbs = nblimbs + 1;
          } while (bVar9);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_add_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, j;
    mbedtls_mpi_uint *o, *p, c, tmp;

    if( X == B )
    {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );

    o = B->p; p = X->p; c = 0;

    /*
     * tmp is used because it might happen that p == o
     */
    for( i = 0; i < j; i++, o++, p++ )
    {
        tmp= *o;
        *p +=  c; c  = ( *p <  c );
        *p += tmp; c += ( *p < tmp );
    }

    while( c != 0 )
    {
        if( i >= X->n )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + 1 ) );
            p = X->p + i;
        }

        *p += c; c = ( *p < c ); i++; p++;
    }

cleanup:

    return( ret );
}